

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.hpp
# Opt level: O0

void write_bounds<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,baryonyx::raw_problem>
               (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *ctx,
               raw_problem *p)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  iterator iVar5;
  const_reference pvVar6;
  basic_string_view<char,_std::char_traits<char>_> *args;
  int *in_R8;
  size_t e;
  size_t i;
  raw_problem *p_local;
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *ctx_local;
  
  e = 0;
  sVar3 = std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::size(&(p->vars).names);
  for (; e != sVar3; e = e + 1) {
    pvVar4 = std::vector<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>::
             operator[](&(p->vars).values,e);
    if (pvVar4->min != 0) {
      iVar5 = fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::out(ctx);
      pvVar6 = std::
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::operator[](&(p->vars).names,e);
      args = (basic_string_view<char,_std::char_traits<char>_> *)
             std::vector<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>::
             operator[](&(p->vars).values,e);
      fmt::v7::
      format_to<fmt::v7::detail::buffer_appender<char>,char[10],std::basic_string_view<char,std::char_traits<char>>const&,int_const&,true>
                ((v7 *)iVar5.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                 (buffer_appender<char>)0xc7dd5d,(char (*) [10])pvVar6,args,in_R8);
    }
    pvVar4 = std::vector<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>::
             operator[](&(p->vars).values,e);
    iVar1 = pvVar4->max;
    iVar2 = std::numeric_limits<int>::max();
    if (iVar1 != iVar2) {
      iVar5 = fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::out(ctx);
      pvVar6 = std::
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::operator[](&(p->vars).names,e);
      pvVar4 = std::vector<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>::
               operator[](&(p->vars).values,e);
      fmt::v7::
      format_to<fmt::v7::detail::buffer_appender<char>,char[10],std::basic_string_view<char,std::char_traits<char>>const&,int_const&,true>
                ((v7 *)iVar5.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                 (buffer_appender<char>)0xc8d8cf,(char (*) [10])pvVar6,
                 (basic_string_view<char,_std::char_traits<char>_> *)&pvVar4->max,in_R8);
    }
  }
  return;
}

Assistant:

void
write_bounds(FormatContext& ctx, const Problem& p)
{
    for (std::size_t i{ 0 }, e{ p.vars.names.size() }; i != e; ++i) {
        if (p.vars.values[i].min != 0)
            fmt::format_to(
              ctx.out(), "{} >= {}\n", p.vars.names[i], p.vars.values[i].min);

        if (p.vars.values[i].max != std::numeric_limits<int>::max())
            fmt::format_to(
              ctx.out(), "{} <= {}\n", p.vars.names[i], p.vars.values[i].max);
    }
}